

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O1

convert_status __thiscall
crunch::convert_file
          (crunch *this,uint32 file_index,uint32 num_files,char *pSrc_filename,char *pDst_filename,
          format out_file_type)

{
  command_line_params *this_00;
  _Rb_tree_header *p_Var1;
  double dVar2;
  bool bVar3;
  format file_format;
  uint uVar4;
  pixel_format fmt;
  param_map_const_iterator pVar5;
  char *pcVar6;
  convert_status cVar7;
  uint32 i;
  uint index;
  timer tim;
  mipmapped_texture src_tex;
  convert_stats stats;
  convert_params params;
  timer local_560;
  mipmapped_texture local_548;
  convert_stats local_500;
  convert_params local_460;
  
  crnlib::timer::timer(&local_560);
  if (num_files < 2) {
    crnlib::console::message("Reading source texture: \"%s\"",pSrc_filename);
  }
  else {
    crnlib::console::message
              ("[%u/%u] Reading source texture: \"%s\"",(ulong)(file_index + 1),(ulong)num_files);
  }
  file_format = crnlib::texture_file_types::determine_file_format(pSrc_filename);
  if (file_format == cFormatInvalid) {
    cVar7 = cCSFailed;
    crnlib::console::error("Unrecognized file type: %s",pSrc_filename);
  }
  else {
    crnlib::mipmapped_texture::mipmapped_texture(&local_548);
    crnlib::timer::start(&local_560);
    bVar3 = crnlib::mipmapped_texture::read_from_file(&local_548,pSrc_filename,file_format);
    if (bVar3) {
      dVar2 = crnlib::timer::get_elapsed_secs(&local_560);
      crnlib::console::info("Texture successfully loaded in %3.3fs",SUB84(dVar2,0));
      this_00 = &this->m_params;
      bVar3 = crnlib::command_line_params::get_value_as_bool(this_00,"converttoluma",0,false);
      if (bVar3) {
        crnlib::mipmapped_texture::convert(&local_548,cConversion_Y_To_RGB);
      }
      bVar3 = crnlib::command_line_params::get_value_as_bool(this_00,"setalphatoluma",0,false);
      if (bVar3) {
        crnlib::mipmapped_texture::convert(&local_548,cConversion_Y_To_A);
      }
      local_460.m_pInput_texture = (mipmapped_texture *)0x0;
      local_460.m_texture_type = cTextureTypeUnknown;
      local_460.m_dst_filename.m_buf_size = 0;
      local_460.m_dst_filename.m_len = 0;
      local_460.m_dst_filename.m_pStr = (char *)0x0;
      local_460.m_dst_file_type = cFormatInvalid;
      local_460.m_dst_format = PIXEL_FMT_INVALID;
      local_460.m_comp_params.m_size_of_obj = 0x378;
      local_460.m_comp_params.m_file_type = cCRNFileTypeCRN;
      local_460.m_comp_params.m_faces = 1;
      local_460.m_comp_params.m_width = 0;
      local_460.m_comp_params.m_height = 0;
      local_460.m_comp_params.m_levels = 1;
      local_460.m_comp_params.m_format = cCRNFmtDXT1;
      local_460.m_comp_params.m_flags = 0xb;
      memset(local_460.m_comp_params.m_pImages,0,0x304);
      local_460.m_comp_params.m_quality_level = 0xff;
      local_460.m_comp_params.m_dxt1a_alpha_threshold = 0x80;
      local_460.m_comp_params.m_dxt_quality = cCRNDXTQualityUber;
      local_460.m_comp_params.m_dxt_compressor_type = cCRNDXTCompressorCRN;
      local_460.m_comp_params.m_alpha_component = 3;
      local_460.m_comp_params.m_crn_adaptive_tile_color_psnr_derating = 2.0;
      local_460.m_comp_params.m_crn_adaptive_tile_alpha_psnr_derating = 2.0;
      local_460.m_comp_params.m_crn_color_endpoint_palette_size = 0;
      local_460.m_comp_params.m_crn_color_selector_palette_size = 0;
      local_460.m_comp_params.m_crn_alpha_endpoint_palette_size = 0;
      local_460.m_comp_params.m_crn_alpha_selector_palette_size = 0;
      local_460.m_comp_params.m_num_helper_threads = 0;
      local_460.m_comp_params.m_userdata0 = 0;
      local_460.m_comp_params.m_userdata1 = 0;
      local_460.m_comp_params.m_pProgress_func = (crn_progress_callback_func)0x0;
      local_460.m_comp_params.m_pProgress_func_data = (void *)0x0;
      local_460.m_mipmap_params.m_size_of_obj = 0x54;
      local_460.m_mipmap_params.m_mode = cCRNMipModeUseSourceOrGenerateMips;
      local_460.m_mipmap_params.m_filter = cCRNMipFilterKaiser;
      local_460.m_mipmap_params.m_gamma_filtering = 1;
      local_460.m_mipmap_params.m_gamma = 2.2;
      local_460.m_mipmap_params.m_blurriness = 0.9;
      local_460.m_mipmap_params.m_renormalize = 0;
      local_460.m_mipmap_params.m_rtopmip = 0;
      local_460.m_mipmap_params.m_tiled = 0;
      local_460.m_mipmap_params.m_scale_mode = cCRNSMDisabled;
      local_460.m_mipmap_params.m_max_levels = 0x10;
      local_460.m_mipmap_params.m_min_mip_size = 1;
      local_460.m_mipmap_params.m_scale_x = 1.0;
      local_460.m_mipmap_params.m_scale_y = 1.0;
      local_460.m_mipmap_params.m_clamp_scale = 0;
      local_460.m_mipmap_params.m_clamp_width = 0;
      local_460.m_mipmap_params.m_clamp_height = 0;
      local_460.m_mipmap_params.m_window_left = 0;
      local_460.m_mipmap_params.m_window_top = 0;
      local_460.m_mipmap_params.m_window_right = 0;
      local_460.m_mipmap_params.m_window_bottom = 0;
      local_460.m_pIntermediate_texture._0_4_ = 0;
      local_460._1036_8_ = 0;
      local_460.m_pProgress_func = (progress_callback_func_ptr)0x0;
      local_460.m_pProgress_user_data._0_4_ = 0;
      local_460.m_pProgress_user_data._4_4_ = 0;
      local_460.m_error_message.m_pStr = (char *)0x0;
      local_460.m_y_flip = false;
      local_460.m_unflip = false;
      local_460.m_always_use_source_pixel_format = false;
      local_460.m_write_mipmaps_to_multiple_files = false;
      local_460.m_quick = false;
      local_460.m_debugging = false;
      local_460.m_param_debugging = false;
      local_460.m_no_stats = false;
      local_460.m_lzma_stats = false;
      local_460.m_status = false;
      local_460.m_canceled = false;
      local_460.m_texture_type = crnlib::mipmapped_texture::determine_texture_type(&local_548);
      local_460.m_pInput_texture = &local_548;
      crnlib::dynamic_string::set(&local_460.m_dst_filename,pDst_filename,0xffffffff);
      local_460.m_dst_file_type = out_file_type;
      pVar5 = crnlib::command_line_params::get_param(this_00,"lzmastats",0);
      p_Var1 = &(this->m_params).m_param_map._M_t._M_impl.super__Rb_tree_header;
      local_460.m_lzma_stats = (_Rb_tree_header *)pVar5._M_node != p_Var1;
      pVar5 = crnlib::command_line_params::get_param(this_00,"split",0);
      local_460.m_write_mipmaps_to_multiple_files = (_Rb_tree_header *)pVar5._M_node != p_Var1;
      pVar5 = crnlib::command_line_params::get_param(this_00,"usesourceformat",0);
      local_460.m_always_use_source_pixel_format = (_Rb_tree_header *)pVar5._M_node != p_Var1;
      pVar5 = crnlib::command_line_params::get_param(this_00,"yflip",0);
      local_460.m_y_flip = (_Rb_tree_header *)pVar5._M_node != p_Var1;
      pVar5 = crnlib::command_line_params::get_param(this_00,"unflip",0);
      local_460.m_unflip = (_Rb_tree_header *)pVar5._M_node != p_Var1;
      bVar3 = crnlib::command_line_params::get_value_as_bool(this_00,"noprogress",0,false);
      if (!bVar3) {
        bVar3 = crnlib::command_line_params::get_value_as_bool(this_00,"quiet",0,false);
        if (!bVar3) {
          local_460.m_pProgress_func = progress_callback_func;
        }
      }
      bVar3 = crnlib::command_line_params::get_value_as_bool(this_00,"debug",0,false);
      if (bVar3) {
        local_460.m_debugging = true;
        local_460.m_comp_params.m_flags = local_460.m_comp_params.m_flags | 0x80000000;
      }
      bVar3 = crnlib::command_line_params::get_value_as_bool(this_00,"paramdebug",0,false);
      if (bVar3) {
        local_460.m_param_debugging = true;
      }
      bVar3 = crnlib::command_line_params::get_value_as_bool(this_00,"quick",0,false);
      if (bVar3) {
        local_460.m_quick = true;
      }
      index = 0;
      local_460.m_no_stats =
           crnlib::command_line_params::get_value_as_bool(this_00,"nostats",0,false);
      local_460._32_8_ = local_460._32_8_ & 0xffffffff;
      do {
        uVar4 = crnlib::pixel_format_helpers::get_num_formats();
        if (uVar4 <= index) goto LAB_0010cc4e;
        fmt = crnlib::pixel_format_helpers::get_pixel_format_by_index(index);
        pcVar6 = crnlib::pixel_format_helpers::get_pixel_format_string(fmt);
        pVar5 = crnlib::command_line_params::get_param(this_00,pcVar6,0);
        index = index + 1;
      } while ((_Rb_tree_header *)pVar5._M_node == p_Var1);
      local_460.m_dst_format = fmt;
LAB_0010cc4e:
      bVar3 = crnlib::texture_file_types::supports_mipmaps(file_format);
      if (bVar3) {
        local_460.m_mipmap_params.m_mode = cCRNMipModeUseSourceMips;
      }
      bVar3 = parse_mipmap_params(this,&local_460.m_mipmap_params);
      cVar7 = cCSBadParam;
      if (bVar3) {
        bVar3 = parse_comp_params(this,local_460.m_dst_file_type,&local_460.m_comp_params);
        if (bVar3) {
          bVar3 = parse_scale_params(this,&local_460.m_mipmap_params);
          if (bVar3) {
            print_texture_info(this,"Source texture",&local_460,&local_548);
            if (local_460.m_texture_type == cTextureTypeNormalMap) {
              local_460.m_comp_params.m_flags = local_460.m_comp_params.m_flags & 0xfffffffe;
            }
            crnlib::texture_conversion::convert_stats::convert_stats(&local_500);
            crnlib::timer::start(&local_560);
            bVar3 = crnlib::texture_conversion::process(&local_460,&local_500);
            dVar2 = crnlib::timer::get_elapsed_secs(&local_560);
            if (bVar3) {
              crnlib::console::info("Texture successfully processed in %3.3fs");
              bVar3 = crnlib::command_line_params::get_value_as_bool(this_00,"nostats",0,false);
              cVar7 = cCSSucceeded;
              if (!bVar3) {
                print_stats(this,&local_500,false);
              }
            }
            else if (local_460.m_error_message.m_len == 0) {
              cVar7 = cCSFailed;
              crnlib::console::error
                        ("Failed writing output file: \"%s\"",SUB84(dVar2,0),pDst_filename);
            }
            else {
              pcVar6 = "";
              if (local_460.m_error_message.m_pStr != (char *)0x0) {
                pcVar6 = local_460.m_error_message.m_pStr;
              }
              cVar7 = cCSFailed;
              crnlib::console::error(pcVar6,SUB84(dVar2,0));
            }
            crnlib::mipmapped_texture::~mipmapped_texture(&local_500.m_output_tex);
            if ((local_500.m_dst_filename.m_pStr != (char *)0x0) &&
               ((*(uint *)(local_500.m_dst_filename.m_pStr + -8) ^
                *(uint *)(local_500.m_dst_filename.m_pStr + -4)) == 0xffffffff)) {
              crnlib::crnlib_free(local_500.m_dst_filename.m_pStr + -0x10);
            }
            if ((local_500.m_src_filename.m_pStr != (char *)0x0) &&
               ((*(uint *)(local_500.m_src_filename.m_pStr + -8) ^
                *(uint *)(local_500.m_src_filename.m_pStr + -4)) == 0xffffffff)) {
              crnlib::crnlib_free(local_500.m_src_filename.m_pStr + -0x10);
            }
          }
        }
      }
      crnlib::texture_conversion::convert_params::~convert_params(&local_460);
    }
    else if (local_548.m_last_error.m_len == 0) {
      cVar7 = cCSFailed;
      crnlib::console::error("Failed reading source file: \"%s\"",pSrc_filename);
    }
    else {
      pcVar6 = "";
      if (local_548.m_last_error.m_pStr != (char *)0x0) {
        pcVar6 = local_548.m_last_error.m_pStr;
      }
      cVar7 = cCSFailed;
      crnlib::console::error("%s",pcVar6);
    }
    crnlib::mipmapped_texture::~mipmapped_texture(&local_548);
  }
  return cVar7;
}

Assistant:

convert_status convert_file(uint32 file_index, uint32 num_files, const char* pSrc_filename, const char* pDst_filename, texture_file_types::format out_file_type)
    {
        timer tim;

        if (num_files > 1)
        {
            console::message("[%u/%u] Reading source texture: \"%s\"", file_index + 1, num_files, pSrc_filename);
        }
        else
        {
            console::message("Reading source texture: \"%s\"", pSrc_filename);
        }

        texture_file_types::format src_file_format = texture_file_types::determine_file_format(pSrc_filename);
        if (src_file_format == texture_file_types::cFormatInvalid)
        {
            console::error("Unrecognized file type: %s", pSrc_filename);
            return cCSFailed;
        }

        mipmapped_texture src_tex;
        tim.start();
        if (!src_tex.read_from_file(pSrc_filename, src_file_format))
        {
            if (src_tex.get_last_error().is_empty())
            {
                console::error("Failed reading source file: \"%s\"", pSrc_filename);
            }
            else
            {
                console::error("%s", src_tex.get_last_error().get_ptr());
            }

            return cCSFailed;
        }
        double total_time = tim.get_elapsed_secs();
        console::info("Texture successfully loaded in %3.3fs", total_time);

        if (m_params.get_value_as_bool("converttoluma"))
        {
            src_tex.convert(image_utils::cConversion_Y_To_RGB);
        }
        if (m_params.get_value_as_bool("setalphatoluma"))
        {
            src_tex.convert(image_utils::cConversion_Y_To_A);
        }

        texture_conversion::convert_params params;

        params.m_texture_type = src_tex.determine_texture_type();
        params.m_pInput_texture = &src_tex;
        params.m_dst_filename = pDst_filename;
        params.m_dst_file_type = out_file_type;
        params.m_lzma_stats = m_params.has_key("lzmastats");
        params.m_write_mipmaps_to_multiple_files = m_params.has_key("split");
        params.m_always_use_source_pixel_format = m_params.has_key("usesourceformat");
        params.m_y_flip = m_params.has_key("yflip");
        params.m_unflip = m_params.has_key("unflip");

        if ((!m_params.get_value_as_bool("noprogress")) && (!m_params.get_value_as_bool("quiet")))
        {
            params.m_pProgress_func = progress_callback_func;
        }

        if (m_params.get_value_as_bool("debug"))
        {
            params.m_debugging = true;
            params.m_comp_params.set_flag(cCRNCompFlagDebugging, true);
        }

        if (m_params.get_value_as_bool("paramdebug"))
        {
            params.m_param_debugging = true;
        }

        if (m_params.get_value_as_bool("quick"))
        {
            params.m_quick = true;
        }

        params.m_no_stats = m_params.get_value_as_bool("nostats");

        params.m_dst_format = PIXEL_FMT_INVALID;

        for (uint32 i = 0; i < pixel_format_helpers::get_num_formats(); i++)
        {
            pixel_format trial_fmt = pixel_format_helpers::get_pixel_format_by_index(i);
            if (m_params.has_key(pixel_format_helpers::get_pixel_format_string(trial_fmt)))
            {
                params.m_dst_format = trial_fmt;
                break;
            }
        }

        if (texture_file_types::supports_mipmaps(src_file_format))
        {
            params.m_mipmap_params.m_mode = cCRNMipModeUseSourceMips;
        }

        if (!parse_mipmap_params(params.m_mipmap_params))
        {
            return cCSBadParam;
        }

        if (!parse_comp_params(params.m_dst_file_type, params.m_comp_params))
        {
            return cCSBadParam;
        }

        if (!parse_scale_params(params.m_mipmap_params))
        {
            return cCSBadParam;
        }

        print_texture_info("Source texture", params, src_tex);

        if (params.m_texture_type == cTextureTypeNormalMap)
        {
            params.m_comp_params.set_flag(cCRNCompFlagPerceptual, false);
        }

        texture_conversion::convert_stats stats;

        tim.start();
        bool status = texture_conversion::process(params, stats);
        total_time = tim.get_elapsed_secs();

        if (!status)
        {
            if (params.m_error_message.is_empty())
            {
                console::error("Failed writing output file: \"%s\"", pDst_filename);
            }
            else
            {
                console::error(params.m_error_message.get_ptr());
            }
            return cCSFailed;
        }

        console::info("Texture successfully processed in %3.3fs", total_time);

        if (!m_params.get_value_as_bool("nostats"))
        {
            print_stats(stats);
        }

        return cCSSucceeded;
    }